

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O2

fdb_status fdb_iterator_get_metaonly(fdb_iterator *iterator,fdb_doc **doc)

{
  atomic<unsigned_char> *paVar1;
  ushort uVar2;
  fdb_kvs_handle *pfVar3;
  docio_handle *handle;
  uint64_t offset;
  fdb_doc *pfVar4;
  int64_t iVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  fdb_status fVar12;
  int64_t iVar13;
  bool bVar14;
  bool bVar15;
  ushort uVar16;
  undefined1 auVar17 [16];
  undefined1 local_68 [4];
  uint uStack_64;
  uint32_t uStack_60;
  byte bStack_5c;
  uint8_t uStack_5b;
  uint16_t uStack_5a;
  timestamp_t local_58;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  undefined6 uVar18;
  
  fVar12 = FDB_RESULT_INVALID_HANDLE;
  if ((iterator != (fdb_iterator *)0x0) &&
     (pfVar3 = iterator->handle, pfVar3 != (fdb_kvs_handle *)0x0)) {
    if (doc == (fdb_doc **)0x0) {
      fVar12 = FDB_RESULT_INVALID_ARGS;
    }
    else {
      local_68._0_2_ = 0;
      local_68._2_2_ = 0;
      uStack_64 = 0;
      uStack_60 = 0;
      bStack_5c = '\0';
      uStack_5b = '\0';
      uStack_5a = 0;
      local_58 = 0;
      local_50 = (undefined1  [16])0x0;
      local_40 = (undefined1  [16])0x0;
      handle = iterator->_dhandle;
      fVar12 = FDB_RESULT_ITERATOR_FAIL;
      if ((handle != (docio_handle *)0x0) && (iterator->_get_offset != 0xffffffffffffffff)) {
        uVar2 = (pfVar3->config).chunksize;
        LOCK();
        bVar14 = (pfVar3->handle_busy).super___atomic_base<unsigned_char>._M_i == '\0';
        if (bVar14) {
          (pfVar3->handle_busy).super___atomic_base<unsigned_char>._M_i = '\x01';
        }
        UNLOCK();
        if (bVar14) {
          offset = iterator->_get_offset;
          pfVar4 = *doc;
          if (pfVar4 == (fdb_doc *)0x0) {
            fVar12 = fdb_doc_create(doc,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
            if (fVar12 != FDB_RESULT_SUCCESS) {
              paVar1 = &iterator->handle->handle_busy;
              LOCK();
              if ((paVar1->super___atomic_base<unsigned_char>)._M_i == '\x01') {
                (paVar1->super___atomic_base<unsigned_char>)._M_i = '\0';
              }
              UNLOCK();
              return fVar12;
            }
            auVar9._8_8_ = 0;
            auVar9._0_8_ = local_50._8_8_;
            local_50 = auVar9 << 0x40;
            auVar10._14_2_ = 0;
            auVar10._0_14_ = stack0xffffffffffffff9a;
            _local_68 = (docio_length)(auVar10 << 0x10);
            local_40 = (undefined1  [16])0x0;
            bVar14 = true;
            bVar15 = true;
          }
          else {
            local_50._8_8_ = 0;
            local_50._0_8_ = pfVar4->key;
            local_40._8_8_ = 0;
            local_40._0_8_ = pfVar4->meta;
            bVar14 = pfVar4->key == (void *)0x0;
            bVar15 = pfVar4->meta == (void *)0x0;
          }
          iVar13 = docio_read_doc_key_meta(handle,offset,(docio_object *)local_68,true);
          if (iVar13 < 1) {
            paVar1 = &iterator->handle->handle_busy;
            LOCK();
            if ((paVar1->super___atomic_base<unsigned_char>)._M_i == '\x01') {
              (paVar1->super___atomic_base<unsigned_char>)._M_i = '\0';
            }
            UNLOCK();
            fdb_doc_free(*doc);
            *doc = (fdb_doc *)0x0;
            iVar5 = -9;
            if (iVar13 != 0) {
              iVar5 = iVar13;
            }
            fVar12 = (fdb_status)iVar5;
          }
          else if ((((undefined1  [16])_local_68 & (undefined1  [16])0x400000000) ==
                    (undefined1  [16])0x0) || ((iterator->opt & 2) == 0)) {
            if (iterator->handle->kvs != (kvs_info *)0x0) {
              uVar11 = (int)local_68 - (uint)uVar2;
              local_68._0_2_ = (keylen_t)uVar11;
              memmove((void *)local_50._0_8_,(void *)((ulong)uVar2 + local_50._0_8_),
                      (ulong)(uVar11 & 0xffff));
            }
            if (bVar14) {
              (*doc)->key = (void *)local_50._0_8_;
            }
            if (bVar15) {
              (*doc)->meta = (void *)local_40._0_8_;
            }
            pfVar4 = *doc;
            auVar6._10_2_ = 0;
            auVar6._0_10_ = local_68._0_10_;
            auVar6._12_2_ = local_68._6_2_;
            auVar7._8_2_ = local_68._4_2_;
            auVar7._0_8_ = local_68._0_8_;
            auVar7._10_4_ = auVar6._10_4_;
            auVar8._6_8_ = 0;
            auVar8._0_6_ = auVar7._8_6_;
            uVar16 = local_68._0_2_;
            uVar18 = 0;
            auVar17._0_8_ = CONCAT62(uVar18,uVar16);
            auVar17._8_4_ = (int)CONCAT82(SUB148(auVar8 << 0x40,6),local_68._2_2_);
            auVar17._12_4_ = 0;
            pfVar4->keylen = auVar17._0_8_;
            pfVar4->metalen = auVar17._8_8_;
            pfVar4->bodylen = (ulong)uStack_64;
            pfVar4->seqnum = local_50._8_8_;
            pfVar4->deleted = (bool)(bStack_5c >> 2 & 1);
            pfVar4->offset = offset;
            fVar12 = FDB_RESULT_SUCCESS;
            paVar1 = &iterator->handle->handle_busy;
            LOCK();
            if ((paVar1->super___atomic_base<unsigned_char>)._M_i == '\x01') {
              (paVar1->super___atomic_base<unsigned_char>)._M_i = '\0';
            }
            UNLOCK();
            atomic_incr_uint64_t
                      (&iterator->handle->op_stats->num_iterator_gets,memory_order_relaxed);
          }
          else {
            if (bVar14) {
              free((void *)local_50._0_8_);
            }
            if (bVar15) {
              free((void *)local_40._0_8_);
            }
            paVar1 = &iterator->handle->handle_busy;
            LOCK();
            if ((paVar1->super___atomic_base<unsigned_char>)._M_i == '\x01') {
              (paVar1->super___atomic_base<unsigned_char>)._M_i = '\0';
            }
            UNLOCK();
            fVar12 = FDB_RESULT_KEY_NOT_FOUND;
          }
        }
        else {
          fVar12 = FDB_RESULT_HANDLE_BUSY;
        }
      }
    }
  }
  return fVar12;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_get_metaonly(fdb_iterator *iterator, fdb_doc **doc)
{
    if (!iterator || !iterator->handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!doc) {
        return FDB_RESULT_INVALID_ARGS;
    }

    struct docio_object _doc;
    fdb_status ret = FDB_RESULT_SUCCESS;
    uint64_t offset;
    int64_t _offset;
    struct docio_handle *dhandle;
    size_t size_chunk = iterator->handle->config.chunksize;
    bool alloced_key, alloced_meta;
    LATENCY_STAT_START();

    dhandle = iterator->_dhandle;
    if (!dhandle || iterator->_get_offset == BLK_NOT_FOUND) {
        return FDB_RESULT_ITERATOR_FAIL;
    }

    if (!atomic_cas_uint8_t(&iterator->handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    offset = iterator->_get_offset;

    if (*doc == NULL) {
        ret = fdb_doc_create(doc, NULL, 0, NULL, 0, NULL, 0);
        if (ret != FDB_RESULT_SUCCESS) { // LCOV_EXCL_START
            atomic_cas_uint8_t(&iterator->handle->handle_busy, 1, 0);
            return ret;
        } // LCOV_EXCL_STOP
        _doc.key = NULL;
        _doc.length.keylen = 0;
        _doc.meta = NULL;
        _doc.body = NULL;
        alloced_key = true;
        alloced_meta = true;
    } else {
        _doc.key = (*doc)->key;
        _doc.meta = (*doc)->meta;
        _doc.body = NULL;
        alloced_key = _doc.key ? false : true;
        alloced_meta = _doc.meta ? false : true;
    }

    _offset = docio_read_doc_key_meta(dhandle, offset, &_doc, true);
    if (_offset <= 0) {
        atomic_cas_uint8_t(&iterator->handle->handle_busy, 1, 0);
        fdb_doc_free(*doc);
        *doc = NULL;
        return _offset < 0 ? (fdb_status)_offset : FDB_RESULT_KEY_NOT_FOUND;
    }
    if (_doc.length.flag & DOCIO_DELETED &&
            (iterator->opt & FDB_ITR_NO_DELETES)) {
        if (alloced_key) {
            free(_doc.key);
        }
        if (alloced_meta) {
            free(_doc.meta);
        }
        atomic_cas_uint8_t(&iterator->handle->handle_busy, 1, 0);
        return FDB_RESULT_KEY_NOT_FOUND;
    }

    if (iterator->handle->kvs) {
        // eliminate KV ID from key
        _doc.length.keylen -= size_chunk;
        memmove(_doc.key, (uint8_t*)_doc.key + size_chunk, _doc.length.keylen);
    }
    if (alloced_key) {
        (*doc)->key = _doc.key;
    }
    if (alloced_meta) {
        (*doc)->meta = _doc.meta;
    }
    (*doc)->keylen = _doc.length.keylen;
    (*doc)->metalen = _doc.length.metalen;
    (*doc)->bodylen = _doc.length.bodylen;
    (*doc)->seqnum = _doc.seqnum;
    (*doc)->deleted = _doc.length.flag & DOCIO_DELETED;
    (*doc)->offset = offset;

    atomic_cas_uint8_t(&iterator->handle->handle_busy, 1, 0);
    atomic_incr_uint64_t(&iterator->handle->op_stats->num_iterator_gets,
                         std::memory_order_relaxed);
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_GET_META);
    return ret;
}